

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

SynchEvent * absl::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  SynchEvent *pSVar4;
  ulong uVar5;
  char *__s;
  uint uVar6;
  bool bVar7;
  
  uVar2 = synch_event_mu;
  if ((synch_event_mu & 1) == 0) {
    synch_event_mu = synch_event_mu | 1;
    LOCK();
    UNLOCK();
  }
  if ((uVar2 & 1) != 0) {
    base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
  }
  uVar5 = (long)addr % 0x407 & 0xffffffff;
  for (pSVar4 = *(SynchEvent **)(synch_event + uVar5 * 8); pSVar4 != (SynchEvent *)0x0;
      pSVar4 = pSVar4->next) {
    if ((pSVar4->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar4->refcount = pSVar4->refcount + 1;
      goto LAB_001493fa;
    }
  }
  __s = "";
  if (name != (char *)0x0) {
    __s = name;
  }
  sVar3 = strlen(__s);
  pSVar4 = (SynchEvent *)base_internal::LowLevelAlloc::Alloc(sVar3 + 0x30);
  pSVar4->refcount = 2;
  pSVar4->masked_addr = (ulong)addr ^ 0xf03a5f7bf03a5f7b;
  pSVar4->invariant = (_func_void_void_ptr *)0x0;
  pSVar4->arg = (void *)0x0;
  pSVar4->log = false;
  strcpy(pSVar4->name,__s);
  pSVar4->next = *(SynchEvent **)(synch_event + uVar5 * 8);
  do {
    do {
      uVar1 = (addr->super___atomic_base<long>)._M_i;
      if ((bits & ~uVar1) == 0) goto LAB_001493f0;
    } while ((uVar1 & lockbit) != 0);
    LOCK();
    bVar7 = uVar1 == (addr->super___atomic_base<long>)._M_i;
    if (bVar7) {
      (addr->super___atomic_base<long>)._M_i = uVar1 | bits;
    }
    UNLOCK();
  } while (!bVar7);
LAB_001493f0:
  *(SynchEvent **)(synch_event + uVar5 * 8) = pSVar4;
LAB_001493fa:
  uVar2 = synch_event_mu;
  uVar6 = synch_event_mu & 2;
  LOCK();
  UNLOCK();
  bVar7 = 7 < synch_event_mu;
  synch_event_mu = uVar6;
  if (bVar7) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar2);
  }
  return pSVar4;
}

Assistant:

static SynchEvent *EnsureSynchEvent(std::atomic<intptr_t> *addr,
                                    const char *name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  // first look for existing SynchEvent struct..
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent *>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;    // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    AtomicSetBits(addr, bits, lockbit);
    synch_event[h] = e;
  } else {
    e->refcount++;      // for return value
  }
  synch_event_mu.Unlock();
  return e;
}